

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_usage.c
# Opt level: O3

float ht_cpu_usage_get_percentage(HT_CPUUsageContext *context)

{
  int iVar1;
  HT_TimestampNs HVar2;
  FILE *__stream;
  size_t sVar3;
  char *pcVar4;
  float fVar5;
  char state;
  int int_data [5];
  unsigned_long stime;
  unsigned_long utime;
  uint flags;
  unsigned_long long_data [4];
  char local_438 [1032];
  
  HVar2 = ht_monotonic_clock_get_timestamp();
  snprintf(local_438,0x20,"/proc/%d/stat",(ulong)(uint)context->pid);
  __stream = fopen(local_438,"r");
  if (__stream != (FILE *)0x0) {
    sVar3 = fread(local_438,1,0x3ff,__stream);
    fclose(__stream);
    if (0x4f < sVar3) {
      local_438[sVar3] = '\0';
      pcVar4 = strrchr(local_438,0x29);
      iVar1 = __isoc99_sscanf(pcVar4 + 2,"%c %d %d %d %d %d %u %lu %lu %lu %lu %lu %lu",&state,
                              int_data,int_data + 1,int_data + 2,int_data + 3,int_data + 4,&flags,
                              long_data,long_data + 1,long_data + 2,long_data + 3,&utime,&stime);
      if (iVar1 == 0xd) {
        fVar5 = ((float)((stime + utime) - context->last_total_time) * 100.0) /
                (((float)(HVar2 - context->last_probe) / 1e+09) * (float)_clock_ticks_per_sec);
        context->value = fVar5;
        context->last_total_time = stime + utime;
        context->last_probe = HVar2;
        return fVar5;
      }
    }
  }
  return -1.0;
}

Assistant:

float
ht_cpu_usage_get_percentage(HT_CPUUsageContext* context)
{
    HT_TimestampNs current_ts = ht_monotonic_clock_get_timestamp();
    unsigned long total_time;
    unsigned long tics;
    float elapsed;

    if (_get_process_time(&total_time, context->pid) == HT_FALSE)
    {
        return -1.0f;
    }

    tics = total_time - context->last_total_time;
    elapsed = (current_ts - context->last_probe) / 1000000000.0f;

    context->value = tics * 100.0f / (_clock_ticks_per_sec * elapsed);
    context->last_total_time = total_time;
    context->last_probe = current_ts;

    return context->value;
}